

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

QRectF * __thiscall
QWidgetWindowPrivate::closestAcceptableGeometry(QWidgetWindowPrivate *this,QRectF *rect)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QWidget *this_00;
  ulong uVar6;
  qreal *in_RDX;
  QWidgetWindowPrivate *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  qreal qVar7;
  qreal qVar8;
  double dVar9;
  double dVar10;
  int dh;
  int dw;
  QWidget *widget;
  QWidgetWindow *q;
  qreal rightOffset;
  qreal leftOffset;
  qreal bottomOffset;
  qreal topOffset;
  QRectF currentGeometry;
  QSize newSize;
  QSize oldSize;
  QSize *in_stack_ffffffffffffff18;
  QWidget *in_stack_ffffffffffffff20;
  QRectF *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  double local_78;
  QSize *in_stack_ffffffffffffff90;
  QWidget *in_stack_ffffffffffffff98;
  double local_60;
  QRectF local_58;
  QSize local_38;
  QSizeF local_30;
  QSize local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RSI);
  this_00 = QWidgetWindow::widget((QWidgetWindow *)0x3b2c99);
  if (((this_00 == (QWidget *)0x0) || (bVar1 = QWidget::isWindow(in_stack_ffffffffffffff20), !bVar1)
      ) || (uVar6 = (**(code **)(*(long *)this_00 + 0x88))(), (uVar6 & 1) == 0)) {
    QRect::QRect((QRect *)in_stack_ffffffffffffff20);
    QRectF::QRectF((QRectF *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (QRect *)in_stack_ffffffffffffff28);
  }
  else {
    local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QRectF::size(in_stack_ffffffffffffff28);
    local_20 = QSizeF::toSize((QSizeF *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    local_38 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QLayout::closestAcceptableSize(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    bVar1 = ::operator==((QSize *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    if (bVar1) {
      QRectF::QRectF(in_RDI);
    }
    else {
      iVar2 = QSize::width((QSize *)0x3b2d8c);
      iVar3 = QSize::width((QSize *)0x3b2d9d);
      iVar3 = iVar2 - iVar3;
      iVar4 = QSize::height((QSize *)0x3b2db6);
      iVar5 = QSize::height((QSize *)0x3b2dc7);
      iVar5 = iVar4 - iVar5;
      in_RDI->xp = -NAN;
      in_RDI->yp = -NAN;
      in_RDI->w = -NAN;
      in_RDI->h = -NAN;
      in_RDI->xp = *in_RDX;
      in_RDI->yp = in_RDX[1];
      in_RDI->w = in_RDX[2];
      in_RDI->h = in_RDX[3];
      local_58.xp = -NAN;
      local_58.yp = -NAN;
      local_58.w = -NAN;
      local_58.h = -NAN;
      QWidget::geometry(this_00);
      QRectF::QRectF((QRectF *)CONCAT44(iVar4,iVar2),(QRect *)in_stack_ffffffffffffff28);
      qVar7 = QRectF::top(in_RDI);
      qVar8 = QRectF::top(&local_58);
      local_60 = qVar7 - qVar8;
      QRectF::bottom(in_RDI);
      QRectF::bottom(&local_58);
      dVar9 = qAbs<double>(&local_60);
      dVar10 = qAbs<double>((double *)&stack0xffffffffffffff98);
      if (dVar9 <= dVar10) {
        qVar7 = QRectF::bottom(in_RDI);
        QRectF::setBottom(in_RDI,qVar7 + (double)iVar5);
      }
      else {
        qVar7 = QRectF::top(in_RDI);
        QRectF::setTop(in_RDI,qVar7 - (double)iVar5);
      }
      QRectF::left(in_RDI);
      QRectF::left(&local_58);
      qVar7 = QRectF::right(in_RDI);
      qVar8 = QRectF::right(&local_58);
      local_78 = qVar7 - qVar8;
      dVar9 = qAbs<double>((double *)&stack0xffffffffffffff90);
      dVar10 = qAbs<double>(&local_78);
      if (dVar9 <= dVar10) {
        qVar7 = QRectF::right(in_RDI);
        QRectF::setRight(in_RDI,qVar7 + (double)iVar3);
      }
      else {
        qVar7 = QRectF::left(in_RDI);
        QRectF::setLeft(in_RDI,qVar7 - (double)iVar3);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRectF QWidgetWindowPrivate::closestAcceptableGeometry(const QRectF &rect) const
{
    Q_Q(const QWidgetWindow);
    const QWidget *widget = q->widget();
    if (!widget || !widget->isWindow() || !widget->hasHeightForWidth())
        return QRect();
    const QSize oldSize = rect.size().toSize();
    const QSize newSize = QLayout::closestAcceptableSize(widget, oldSize);
    if (newSize == oldSize)
        return QRectF();
    const int dw = newSize.width() - oldSize.width();
    const int dh = newSize.height() - oldSize.height();
    QRectF result = rect;
    const QRectF currentGeometry(widget->geometry());
    const qreal topOffset = result.top() - currentGeometry.top();
    const qreal bottomOffset = result.bottom() - currentGeometry.bottom();
    if (qAbs(topOffset) > qAbs(bottomOffset))
        result.setTop(result.top() - dh); // top edge drag
    else
        result.setBottom(result.bottom() + dh); // bottom edge drag
    const qreal leftOffset = result.left() - currentGeometry.left();
    const qreal rightOffset = result.right() - currentGeometry.right();
    if (qAbs(leftOffset) > qAbs(rightOffset))
        result.setLeft(result.left() - dw); // left edge drag
    else
        result.setRight(result.right() + dw); // right edge drag
    return result;
}